

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O3

R2Rect * __thiscall R2Rect::Expanded(R2Rect *this,R2Point *margin)

{
  double dVar1;
  double dVar2;
  R2Rect *in_RDI;
  VType VVar3;
  double dVar4;
  VType VVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = this->bounds_[0].bounds_.c_[0];
  dVar7 = this->bounds_[0].bounds_.c_[1];
  dVar6 = dVar7;
  if (dVar4 <= dVar7) {
    dVar6 = margin->c_[0] + dVar7;
  }
  dVar2 = (double)(~-(ulong)(dVar7 < dVar4) & (ulong)(dVar4 - margin->c_[0]) |
                  (ulong)dVar4 & -(ulong)(dVar7 < dVar4));
  dVar4 = this->bounds_[1].bounds_.c_[0];
  dVar7 = this->bounds_[1].bounds_.c_[1];
  dVar1 = (double)(-(ulong)(dVar7 < dVar4) & (ulong)dVar7 |
                  ~-(ulong)(dVar7 < dVar4) & (ulong)(margin->c_[1] + dVar7));
  if (dVar4 <= dVar7) {
    dVar4 = dVar4 - margin->c_[1];
  }
  dVar7 = 1.0;
  if (dVar4 <= dVar1 && dVar2 <= dVar6) {
    dVar7 = dVar2;
  }
  VVar5 = 1.0;
  dVar8 = 0.0;
  VVar3 = 0.0;
  if (dVar4 <= dVar1 && dVar2 <= dVar6) {
    VVar5 = dVar4;
    dVar8 = dVar1;
    VVar3 = dVar6;
  }
  in_RDI->bounds_[0].bounds_.c_[0] = dVar7;
  in_RDI->bounds_[0].bounds_.c_[1] = VVar3;
  in_RDI->bounds_[1].bounds_.c_[0] = VVar5;
  in_RDI->bounds_[1].bounds_.c_[1] = dVar8;
  return in_RDI;
}

Assistant:

R2Rect R2Rect::Expanded(const R2Point& margin) const {
  R1Interval xx = x().Expanded(margin.x());
  R1Interval yy = y().Expanded(margin.y());
  if (xx.is_empty() || yy.is_empty()) return Empty();
  return R2Rect(xx, yy);
}